

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextBlockData>::insert_single
          (QFragmentMapData<QTextBlockData> *this,int key,uint length)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  uint x;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Header *pHVar10;
  uint uVar11;
  
  x = createFragment(this);
  uVar5 = (ulong)x;
  lVar8 = 0;
  *(undefined4 *)((long)(this->field_0).head + uVar5 * 0x48 + 4) = 0;
  *(undefined4 *)((long)(this->field_0).head + uVar5 * 0x48 + 8) = 0;
  (this->field_0).fragments[uVar5].super_QFragment<3>.size_array[0] = length;
  do {
    *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + uVar5 * 0x48 + 0x20) = 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  lVar8 = 0;
  do {
    *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + uVar5 * 0x48 + 0x10) = 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  pHVar10 = (this->field_0).head;
  uVar11 = pHVar10->root;
  if (uVar11 == 0) {
    uVar6 = 0;
    bVar3 = false;
  }
  else {
    do {
      uVar6 = (ulong)uVar11;
      uVar2 = *(uint *)((long)pHVar10 + (ulong)uVar11 * 0x48 + 0x10);
      lVar8 = 4;
      bVar3 = uVar2 < (uint)key;
      if (uVar2 < (uint)key) {
        key = key - (uVar2 + *(int *)((long)pHVar10 + (ulong)uVar11 * 0x48 + 0x1c));
        lVar8 = 8;
      }
      uVar11 = *(uint *)((long)pHVar10 + lVar8 + (ulong)uVar11 * 0x48);
    } while (uVar11 != 0);
  }
  iVar4 = (int)uVar6;
  *(int *)((long)pHVar10 + uVar5 * 0x48) = iVar4;
  pHVar10 = (this->field_0).head;
  if (iVar4 == 0) {
    pHVar10->root = x;
  }
  else if (bVar3) {
    *(uint *)((long)pHVar10 + uVar6 * 0x48 + 8) = x;
  }
  else {
    *(uint *)((long)pHVar10 + uVar6 * 0x48 + 4) = x;
    lVar8 = 0;
    do {
      *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + uVar6 * 0x48 + 0x10) =
           *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + uVar5 * 0x48 + 0x1c);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  if (iVar4 != 0) {
    pHVar10 = (this->field_0).head;
    uVar11 = *(uint *)((long)pHVar10 + uVar6 * 0x48);
    if (uVar11 != 0) {
      do {
        uVar7 = (ulong)uVar11;
        uVar9 = (ulong)uVar11;
        if (*(int *)((long)pHVar10 + uVar9 * 0x48 + 4) == (int)uVar6) {
          lVar8 = 0;
          do {
            piVar1 = (int *)((long)(this->field_0).head + lVar8 * 4 + uVar9 * 0x48 + 0x10);
            *piVar1 = *piVar1 + *(int *)((long)(this->field_0).head +
                                        lVar8 * 4 + uVar5 * 0x48 + 0x1c);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
        }
        pHVar10 = (this->field_0).head;
        uVar11 = *(uint *)((long)pHVar10 + uVar9 * 0x48);
        uVar6 = uVar7;
      } while (uVar11 != 0);
    }
  }
  rebalance(this,x);
  return x;
}

Assistant:

uint QFragmentMapData<Fragment>::insert_single(int key, uint length)
{
    Q_ASSERT(!findNode(key) || (int)this->position(findNode(key)) == key);

    uint z = createFragment();

    F(z).left = 0;
    F(z).right = 0;
    F(z).size_array[0] = length;
    for (uint field = 1; field < Fragment::size_array_max; ++field)
        F(z).size_array[field] = 1;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(z).size_left_array[field] = 0;

    uint y = 0;
    uint x = root();

    Q_ASSERT(!x || F(x).parent == 0);

    uint s = key;
    bool right = false;
    while (x) {
        y = x;
        if (s <= F(x).size_left_array[0]) {
            x = F(x).left;
            right = false;
        } else {
            s -= F(x).size_left_array[0] + F(x).size_array[0];
            x = F(x).right;
            right = true;
        }
    }

    F(z).parent = y;
    if (!y) {
        head->root = z;
    } else if (!right) {
        F(y).left = z;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_array[field];
    } else {
        F(y).right = z;
    }
    while (y && F(y).parent) {
        uint p = F(y).parent;
        if (F(p).left == y) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] += F(z).size_array[field];
        }
        y = p;
    }
    rebalance(z);

    return z;
}